

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_openssl.c
# Opt level: O0

int bind_helper(ENGINE *e)

{
  int iVar1;
  RSA_METHOD *rsa_meth;
  DSA_METHOD *dsa_meth;
  EC_KEY_METHOD *ec_meth;
  DH_METHOD *dh_meth;
  RAND_METHOD *rand_meth;
  ENGINE *in_RDI;
  
  iVar1 = ENGINE_set_id((ENGINE *)in_RDI,engine_openssl_id);
  if (((iVar1 != 0) && (iVar1 = ENGINE_set_name((ENGINE *)in_RDI,engine_openssl_name), iVar1 != 0))
     && (iVar1 = ENGINE_set_destroy_function((ENGINE *)in_RDI,openssl_destroy), iVar1 != 0)) {
    rsa_meth = RSA_get_default_method();
    iVar1 = ENGINE_set_RSA((ENGINE *)in_RDI,rsa_meth);
    if (iVar1 != 0) {
      dsa_meth = DSA_get_default_method();
      iVar1 = ENGINE_set_DSA((ENGINE *)in_RDI,dsa_meth);
      if (iVar1 != 0) {
        ec_meth = EC_KEY_OpenSSL();
        iVar1 = ENGINE_set_EC(in_RDI,ec_meth);
        if (iVar1 != 0) {
          dh_meth = DH_get_default_method();
          iVar1 = ENGINE_set_DH((ENGINE *)in_RDI,dh_meth);
          if (iVar1 != 0) {
            rand_meth = RAND_OpenSSL();
            iVar1 = ENGINE_set_RAND((ENGINE *)in_RDI,(RAND_METHOD *)rand_meth);
            if (((iVar1 != 0) &&
                (iVar1 = ENGINE_set_ciphers((ENGINE *)in_RDI,openssl_ciphers), iVar1 != 0)) &&
               (iVar1 = ENGINE_set_digests((ENGINE *)in_RDI,openssl_digests), iVar1 != 0)) {
              return 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int bind_helper(ENGINE *e)
{
    if (!ENGINE_set_id(e, engine_openssl_id)
        || !ENGINE_set_name(e, engine_openssl_name)
        || !ENGINE_set_destroy_function(e, openssl_destroy)
#ifndef TEST_ENG_OPENSSL_NO_ALGORITHMS
        || !ENGINE_set_RSA(e, RSA_get_default_method())
# ifndef OPENSSL_NO_DSA
        || !ENGINE_set_DSA(e, DSA_get_default_method())
# endif
# ifndef OPENSSL_NO_EC
        || !ENGINE_set_EC(e, EC_KEY_OpenSSL())
# endif
# ifndef OPENSSL_NO_DH
        || !ENGINE_set_DH(e, DH_get_default_method())
# endif
        || !ENGINE_set_RAND(e, RAND_OpenSSL())
# ifdef TEST_ENG_OPENSSL_RC4
        || !ENGINE_set_ciphers(e, openssl_ciphers)
# endif
# ifdef TEST_ENG_OPENSSL_SHA
        || !ENGINE_set_digests(e, openssl_digests)
# endif
#endif
#ifdef TEST_ENG_OPENSSL_PKEY
        || !ENGINE_set_load_privkey_function(e, openssl_load_privkey)
#endif
#ifdef TEST_ENG_OPENSSL_HMAC
        || !ossl_register_hmac_meth()
        || !ENGINE_set_pkey_meths(e, ossl_pkey_meths)
#endif
        )
        return 0;
    /*
     * If we add errors to this ENGINE, ensure the error handling is setup
     * here
     */
    /* openssl_load_error_strings(); */
    return 1;
}